

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteSmv.c
# Opt level: O0

char * cleanUNSAFE(char *s)

{
  char cVar1;
  size_t sVar2;
  char *local_18;
  char *t;
  char *s_local;
  
  sVar2 = strlen(s);
  if (sVar2 < 0x400) {
    strcpy(cleanUNSAFE::buffer,s);
    for (local_18 = cleanUNSAFE::buffer; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == '|') {
        cVar1 = '_';
      }
      else {
        cVar1 = *local_18;
      }
      *local_18 = cVar1;
    }
    return cleanUNSAFE::buffer;
  }
  __assert_fail("strlen(s) < 1024",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioWriteSmv.c"
                ,0x31,"char *cleanUNSAFE(const char *)");
}

Assistant:

static char *cleanUNSAFE( const char *s )
{
    char *t;
    static char buffer[1024];
    assert (strlen(s) < 1024);
    strcpy(buffer, s);
    for (t = buffer; *t != 0; ++t) *t = (*t == '|') ? '_' : *t;
    return buffer;
}